

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O3

deBool deProcess_closeStdErr(deProcess *process)

{
  deFile *file;
  
  file = process->standardErr;
  if (file != (deFile *)0x0) {
    deFile_destroy(file);
    process->standardErr = (deFile *)0x0;
  }
  return (uint)(file != (deFile *)0x0);
}

Assistant:

deBool deProcess_closeStdErr (deProcess* process)
{
	if (process->standardErr)
	{
		deFile_destroy(process->standardErr);
		process->standardErr = DE_NULL;
		return DE_TRUE;
	}
	else
		return DE_FALSE;
}